

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbf_reader.hpp
# Opt level: O0

void __thiscall protozero::pbf_reader::skip(pbf_reader *this)

{
  pbf_tag_type pVar1;
  pbf_wire_type pVar2;
  pbf_length_type len;
  assert_error *this_00;
  pbf_reader *this_local;
  
  pVar1 = tag(this);
  if (pVar1 != 0) {
    pVar2 = wire_type(this);
    switch(pVar2) {
    case varint:
      skip_varint(&this->m_data,this->m_end);
      break;
    case fixed64:
      skip_bytes(this,8);
      break;
    case length_delimited:
      len = get_length(this);
      skip_bytes(this,len);
      break;
    default:
      break;
    case fixed32:
      skip_bytes(this,4);
    }
    return;
  }
  this_00 = (assert_error *)__cxa_allocate_exception(0x10);
  assert_error::assert_error(this_00,"tag() != 0 && \"call next() before calling skip()\"");
  __cxa_throw(this_00,&assert_error::typeinfo,assert_error::~assert_error);
}

Assistant:

void skip() {
        protozero_assert(tag() != 0 && "call next() before calling skip()");
        switch (wire_type()) {
            case pbf_wire_type::varint:
                skip_varint(&m_data, m_end);
                break;
            case pbf_wire_type::fixed64:
                skip_bytes(8);
                break;
            case pbf_wire_type::length_delimited:
                skip_bytes(get_length());
                break;
            case pbf_wire_type::fixed32:
                skip_bytes(4);
                break;
            default:
                break;
        }
    }